

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O1

void __thiscall HashUtil_Sha512ByteData160_Test::TestBody(HashUtil_Sha512ByteData160_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar;
  ByteData byte_data;
  ByteData160 target;
  AssertHelper AStack_78;
  string local_70;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  ByteData local_40;
  ByteData160 local_28;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"0123456789abcdef0123456789abcdef01234567","");
  cfd::core::ByteData160::ByteData160(&local_28,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  cfd::core::HashUtil::Sha512(&local_40,&local_28);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_70,&local_40);
  testing::internal::CmpHelperSTREQ
            (local_50,"byte_data.GetHex().c_str()",
             "\"a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70\""
             ,local_70._M_dataplus._M_p,
             "a0328b2336a761329ef0ce5bd23743173cad5528bfc21cc7b493ea6a1f4cd7ef888e6fb7ca8f294e8e5f2d2459bc72880522bd43d64e5068bc2a8ea21d27ea70"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_hashutil.cpp"
               ,0x135,message);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&AStack_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_70._M_dataplus._M_p + 8))();
      }
      local_70._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HashUtil, Sha256BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2213d0c45bf1ece1a9b0c2d5a21d603601e88e22ae2786fe3f0060ee4aad321d");
}